

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O3

Instr * __thiscall LowererMD::LoadArgumentsFromFrame(LowererMD *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  undefined4 *puVar4;
  RegOpnd *baseOpnd;
  IndirOpnd *this_00;
  StackSym *pSVar5;
  Func *pFVar6;
  
  bVar2 = JITTimeWorkItem::IsLoopBody(this->m_func->m_workItem);
  pFVar6 = this->m_func;
  if (bVar2) {
    pSVar5 = pFVar6->m_loopParamSym;
    if (pSVar5 == (StackSym *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,600,"(this->m_func->GetLoopParamSym())","this->m_func->GetLoopParamSym()")
      ;
      if (!bVar2) goto LAB_0065047e;
      *puVar4 = 0;
      pFVar6 = this->m_func;
      pSVar5 = pFVar6->m_loopParamSym;
    }
    baseOpnd = IR::RegOpnd::New(pSVar5,TyInt64,pFVar6);
    this_00 = IR::IndirOpnd::New(baseOpnd,0x40,TyInt64,this->m_func,false);
  }
  else {
    pSVar5 = StackSym::New(TyInt64,pFVar6);
    pSVar5->m_offset = -8;
    pSVar5->field_0x19 = pSVar5->field_0x19 | 0x10;
    this_00 = (IndirOpnd *)IR::SymOpnd::New(&pSVar5->super_Sym,TyInt64,pFVar6);
  }
  if (instr->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar2) goto LAB_0065047e;
    *puVar4 = 0;
  }
  pFVar6 = instr->m_func;
  if ((this_00->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar2) {
LAB_0065047e:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  bVar3 = (this_00->super_Opnd).field_0xb;
  if ((bVar3 & 2) != 0) {
    this_00 = (IndirOpnd *)IR::Opnd::Copy(&this_00->super_Opnd,pFVar6);
    bVar3 = (this_00->super_Opnd).field_0xb;
  }
  (this_00->super_Opnd).field_0xb = bVar3 | 2;
  instr->m_src1 = &this_00->super_Opnd;
  instr->m_opcode = MOV;
  return instr->m_prev;
}

Assistant:

IR::Instr *
LowererMD::LoadArgumentsFromFrame(IR::Instr * instr)
{
    if (this->m_func->IsLoopBody())
    {
        // Get the arguments ptr from the interpreter frame instance that was passed in.
        Assert(this->m_func->GetLoopParamSym());
        IR::RegOpnd *baseOpnd = IR::RegOpnd::New(this->m_func->GetLoopParamSym(), TyMachReg, this->m_func);
        int32 offset = (int32)Js::InterpreterStackFrame::GetOffsetOfArguments();
        instr->SetSrc1(IR::IndirOpnd::New(baseOpnd, offset, TyMachReg, this->m_func));
    }
    else
    {
        instr->SetSrc1(LowererMD::CreateStackArgumentsSlotOpnd(this->m_func));
    }

    instr->m_opcode = Js::OpCode::MOV;

    return instr->m_prev;
}